

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O0

bool __thiscall
google::protobuf::internal::ReflectionSchema::InRealOneof
          (ReflectionSchema *this,FieldDescriptor *field)

{
  OneofDescriptor *pOVar1;
  FieldDescriptor *field_local;
  ReflectionSchema *this_local;
  
  pOVar1 = FieldDescriptor::real_containing_oneof(field);
  return pOVar1 != (OneofDescriptor *)0x0;
}

Assistant:

bool InRealOneof(const FieldDescriptor* field) const {
    return field->real_containing_oneof();
  }